

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityCosseratAdvanced::ComputeStress
          (ChElasticityCosseratAdvanced *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar20;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  dVar19 = cos(this->alpha);
  auVar26._0_8_ = sin(this->alpha);
  auVar26._8_56_ = extraout_var;
  dVar1 = (this->super_ChElasticityCosseratSimple).Iyy;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1;
  dVar2 = (this->super_ChElasticityCosseratSimple).Izz;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar2;
  dVar3 = this->Cz;
  dVar4 = (this->super_ChElasticityCosseratSimple).A;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar4;
  dVar20 = (this->super_ChElasticityCosseratSimple).E;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar20;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar19 * dVar19;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar26._0_8_ * auVar26._0_8_ * dVar2;
  auVar13 = vfmadd231sd_fma(auVar53,auVar43,auVar39);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar26._0_8_ * auVar26._0_8_ * dVar1;
  auVar14 = vfmadd231sd_fma(auVar49,auVar46,auVar39);
  dVar1 = this->Cy;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  auVar17._8_8_ = 0x8000000000000000;
  auVar17._0_8_ = 0x8000000000000000;
  auVar18 = vxorpd_avx512vl(auVar40,auVar17);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2 * dVar20;
  auVar15 = vfmsub231sd_fma(auVar47,auVar28,auVar43);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar3 * dVar3;
  auVar11 = vfmadd213sd_fma(auVar56,auVar34,auVar13);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar1 * dVar1;
  auVar12 = vfmadd213sd_fma(auVar57,auVar34,auVar14);
  dVar2 = dVar3 * dVar20 * dVar4;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar4 * dVar3 * dVar1 * dVar20;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar19 * auVar15._0_8_;
  auVar16 = vfmsub231sd_fma(auVar29,auVar26._0_16_,auVar44);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = strain_n->m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2 * strain_m->m_data[1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar20 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar21,auVar36,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = strain_m->m_data[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar18._0_8_ * dVar20 * dVar4;
  auVar13 = vfmadd231sd_fma(auVar13,auVar59,auVar14);
  stress_n->m_data[0] = auVar13._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = strain_n->m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar11._0_8_ * dVar20 * strain_m->m_data[1];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar2;
  auVar13 = vfmadd231sd_fma(auVar22,auVar58,auVar15);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = strain_m->m_data[2];
  auVar13 = vfmadd231sd_fma(auVar13,auVar16,auVar11);
  stress_m->m_data[1] = auVar13._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = strain_n->m_data[0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar16._0_8_ * strain_m->m_data[1];
  auVar13 = vfmadd231sd_fma(auVar23,auVar59,auVar18);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = strain_m->m_data[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar12._0_8_ * dVar20;
  auVar13 = vfmadd231sd_fma(auVar13,auVar50,auVar16);
  stress_m->m_data[2] = auVar13._0_8_;
  dVar20 = cos(this->beta);
  auVar27._0_8_ = sin(this->beta);
  auVar27._8_56_ = extraout_var_00;
  dVar1 = (this->super_ChElasticityCosseratSimple).G;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  dVar2 = (this->super_ChElasticityCosseratSimple).A;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar20;
  dVar4 = dVar1 * (this->super_ChElasticityCosseratSimple).Ks_y * dVar2;
  dVar2 = dVar2 * dVar1 * (this->super_ChElasticityCosseratSimple).Ks_z;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar4;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar20 * dVar20;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar27._0_8_ * auVar27._0_8_ * dVar2;
  auVar14 = vfmadd231sd_fma(auVar48,auVar37,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar20 * dVar20 * dVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar27._0_8_ * auVar27._0_8_;
  auVar15 = vfmadd231sd_fma(auVar42,auVar37,auVar45);
  dVar1 = this->Sz;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (this->super_ChElasticityCosseratSimple).J;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar4 * dVar1 * dVar1;
  auVar13 = vfmadd231sd_fma(auVar51,auVar30,auVar12);
  dVar3 = this->Sy;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar3 * dVar3;
  auVar13 = vfmadd213sd_fma(auVar54,auVar35,auVar13);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2 * dVar3;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar20 * dVar4 * dVar1;
  auVar18 = vfmsub231sd_fma(auVar38,auVar31,auVar27._0_16_);
  dVar20 = dVar20 * auVar27._0_8_ * (dVar2 - dVar4);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar27._0_8_ * dVar4 * dVar1;
  auVar11 = vfmadd231sd_fma(auVar24,auVar31,auVar55);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = strain_n->m_data[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar20 * strain_n->m_data[2];
  auVar14 = vfmadd231sd_fma(auVar32,auVar14,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = strain_m->m_data[0];
  auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar6);
  stress_n->m_data[1] = auVar14._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = strain_n->m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar15._0_8_ * strain_n->m_data[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar20;
  auVar14 = vfmadd231sd_fma(auVar33,auVar52,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = strain_m->m_data[0];
  auVar14 = vfmadd231sd_fma(auVar14,auVar11,auVar8);
  stress_n->m_data[2] = auVar14._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = strain_n->m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar11._0_8_ * strain_n->m_data[2];
  auVar14 = vfmadd231sd_fma(auVar25,auVar18,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = strain_m->m_data[0];
  auVar13 = vfmadd231sd_fma(auVar14,auVar13,auVar10);
  stress_m->m_data[0] = auVar13._0_8_;
  return;
}

Assistant:

void ChElasticityCosseratAdvanced::ComputeStress(ChVector<>& stress_n,
                                                 ChVector<>& stress_m,
                                                 const ChVector<>& strain_n,
                                                 const ChVector<>& strain_m) {
    double cos_alpha = cos(alpha);
    double sin_alpha = sin(alpha);
    double a11 = E * A;
    double a22 = E * (Iyy * pow(cos_alpha, 2.) + Izz * pow(sin_alpha, 2.) + Cz * Cz * A);
    double a33 = E * (Izz * pow(cos_alpha, 2.) + Iyy * pow(sin_alpha, 2.) + Cy * Cy * A);
    double a12 = Cz * E * A;
    double a13 = -Cy * E * A;
    double a23 = (E * Iyy - E * Izz) * cos_alpha * sin_alpha - E * Cy * Cz * A;
    stress_n.x() = a11 * strain_n.x() + a12 * strain_m.y() + a13 * strain_m.z();
    stress_m.y() = a12 * strain_n.x() + a22 * strain_m.y() + a23 * strain_m.z();
    stress_m.z() = a13 * strain_n.x() + a23 * strain_m.y() + a33 * strain_m.z();
    double cos_beta = cos(beta);
    double sin_beta = sin(beta);
    double KsyGA = Ks_y * G * A;
    double KszGA = Ks_z * G * A;
    double s11 = KsyGA * pow(cos_beta, 2.) + KszGA * pow(sin_beta, 2.);
    double s22 = KsyGA * pow(sin_beta, 2.) + KszGA * pow(cos_beta, 2.);  // ..+s_loc_12*sin(beta)*cos(beta);
    double s33 = G * J + Sz * Sz * KsyGA + Sy * Sy * KszGA;
    double s12 = (KszGA - KsyGA) * sin_beta * cos_beta;
    double s13 = Sy * KszGA * sin_beta - Sz * KsyGA * cos_beta;
    double s23 = Sy * KszGA * cos_beta + Sz * KsyGA * sin_beta;
    stress_n.y() = s11 * strain_n.y() + s12 * strain_n.z() + s13 * strain_m.x();
    stress_n.z() = s12 * strain_n.y() + s22 * strain_n.z() + s23 * strain_m.x();
    stress_m.x() = s13 * strain_n.y() + s23 * strain_n.z() + s33 * strain_m.x();
}